

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void * __thiscall mpt::array::set(array *this,size_t len,void *base)

{
  bool bVar1;
  type_traits *ptVar2;
  size_t sVar3;
  void *pvVar4;
  void *ptr;
  size_t used;
  content *d;
  void *base_local;
  size_t len_local;
  array *this_local;
  
  used = (size_t)reference<mpt::array::content>::instance(&this->_buf);
  if ((buffer *)used != (buffer *)0x0) {
    ptVar2 = buffer::content_traits((buffer *)used);
    if ((ptVar2 != (type_traits *)0x0) || (bVar1 = buffer::shared((buffer *)used), bVar1)) {
      used = 0;
    }
    else {
      sVar3 = content::length((content *)used);
      if (sVar3 < len) {
        pvVar4 = buffer::append((buffer *)used,len - sVar3);
        if (pvVar4 == (void *)0x0) {
          used = 0;
        }
      }
      else {
        content::set_length((content *)used,len);
      }
    }
  }
  if (used == 0) {
    used = (size_t)buffer::create(len,(type_traits *)0x0);
    if ((buffer *)used == (buffer *)0x0) {
      return (void *)0x0;
    }
    pvVar4 = buffer::append((buffer *)used,len);
    if (pvVar4 == (void *)0x0) {
      (*((buffer *)used)->_vptr_buffer[1])();
      return (void *)0x0;
    }
    reference<mpt::array::content>::set_instance(&this->_buf,(content *)used);
  }
  pvVar4 = content::data((content *)used);
  if (base == (void *)0x0) {
    memset(pvVar4,0,len);
  }
  else {
    memcpy(pvVar4,base,len);
  }
  return pvVar4;
}

Assistant:

void *array::set(size_t len, const void *base)
{
	content *d;
	
	if ((d = _buf.instance())) {
		size_t used;
		/* incompatible target buffer */
		if (d->content_traits() || d->shared()) {
			d = 0;
		}
		else if (len <= (used = d->length())) {
			d->set_length(len);
		}
		/* reserve uninitialized data */
		else if (!d->append(len - used)) {
			d = 0;
		}
	}
	if (!d) {
		if (!(d = static_cast<content *>(buffer::create(len)))) {
			return 0;
		}
		/* reserve uninitialized data */
		if (!d->append(len)) {
			d->unref();
			return 0;
		}
		_buf.set_instance(d);
	}
	void *ptr = d->data();
	if (base) {
		memcpy(ptr, base, len);
	} else {
		memset(ptr, 0, len);
	}
	return ptr;
}